

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  int iVar1;
  FILE *pFVar2;
  size_t __size;
  uchar *__ptr;
  size_t sVar3;
  uint uVar4;
  
  pFVar2 = fopen(filename,"rb");
  uVar4 = 0x4e;
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = fseek(pFVar2,0,2);
    if ((iVar1 == 0) && (__size = ftell(pFVar2), __size != 0x7fffffffffffffff)) {
      fclose(pFVar2);
      if (-1 < (long)__size) {
        *outsize = __size;
        __ptr = (uchar *)malloc(__size);
        *out = __ptr;
        uVar4 = 0x53;
        if (__size == 0 || __ptr != (uchar *)0x0) {
          pFVar2 = fopen(filename,"rb");
          uVar4 = 0x4e;
          if (pFVar2 != (FILE *)0x0) {
            sVar3 = fread(__ptr,1,__size,pFVar2);
            fclose(pFVar2);
            uVar4 = 0x4e;
            if (sVar3 == __size) {
              uVar4 = 0;
            }
          }
        }
      }
    }
    else {
      fclose(pFVar2);
      uVar4 = 0x4e;
    }
  }
  return uVar4;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename) {
  long size = lodepng_filesize(filename);
  if(size < 0) return 78;
  *outsize = (size_t)size;

  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(!(*out) && size > 0) return 83; /*the above malloc failed*/

  return lodepng_buffer_file(*out, (size_t)size, filename);
}